

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O2

void re2c::prtChOrHexForSpan(ostream *o,uint32_t c)

{
  opt_t *poVar1;
  
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (((poVar1->encoding).type_ != EBCDIC) && (c != 0x5d && c - 0x20 < 0x5f)) {
    prtCh(o,c);
    return;
  }
  prtHex(o,c);
  return;
}

Assistant:

void prtChOrHexForSpan(std::ostream& o, uint32_t c)
{
	if (opts->encoding.type () != Enc::EBCDIC
		&& is_print (c)
		&& (c != ']'))
	{
		prtCh(o, c);
	}
	else
	{
		prtHex(o, c);
	}
}